

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

holder<cs::structure> * __thiscall
cs::allocator_type<cs_impl::any::holder<cs::structure>,64ul,cs_impl::default_allocator_provider>::
alloc<cs::type_id&,std::__cxx11::string&,cs::domain_type_const&>
          (allocator_type<cs_impl::any::holder<cs::structure>,_64UL,_cs_impl::default_allocator_provider>
           *this,type_id *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          domain_type *args_2)

{
  size_t sVar1;
  __int_type_conflict _Var2;
  holder<cs::structure> *__p;
  new_allocator<cs_impl::any::holder<cs::structure>_> *in_RCX;
  type_id *in_RDI;
  holder<cs::structure> *ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  size_type __n;
  
  __n = 0;
  if (in_RDI[0x20].type_hash != 0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base<unsigned_long> *)0x0);
    if (_Var2 == 0) {
      sVar1 = in_RDI[0x20].type_hash;
      in_RDI[0x20].type_hash = sVar1 - 1;
      __p = *(holder<cs::structure> **)((long)in_RDI + sVar1 * 8 + -8);
      goto LAB_0020627c;
    }
  }
  __p = __gnu_cxx::new_allocator<cs_impl::any::holder<cs::structure>_>::allocate(in_RCX,__n,in_RDI);
LAB_0020627c:
  __gnu_cxx::new_allocator<cs_impl::any::holder<cs::structure>>::
  construct<cs_impl::any::holder<cs::structure>,cs::type_id&,std::__cxx11::string&,cs::domain_type_const&>
            (in_RCX,__p,in_RDI,in_stack_ffffffffffffffc8,(domain_type *)0x2062a1);
  return __p;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}